

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.c
# Opt level: O2

void duckdb_je_ehooks_default_zero_impl(void *addr,size_t size)

{
  _Bool _Var1;
  
  if (duckdb_je_opt_thp != thp_mode_always) {
    _Var1 = duckdb_je_pages_purge_forced(addr,size);
    if (!_Var1) {
      return;
    }
  }
  switchD_016d4fed::default(addr,0,size);
  return;
}

Assistant:

void
ehooks_default_zero_impl(void *addr, size_t size) {
	/*
	 * By default, we try to zero out memory using OS-provided demand-zeroed
	 * pages.  If the user has specifically requested hugepages, though, we
	 * don't want to purge in the middle of a hugepage (which would break it
	 * up), so we act conservatively and use memset.
	 */
	bool needs_memset = true;
	if (opt_thp != thp_mode_always) {
		needs_memset = pages_purge_forced(addr, size);
	}
	if (needs_memset) {
		memset(addr, 0, size);
	}
}